

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d1_pkt.cc
# Opt level: O0

int __thiscall
bssl::dtls1_write_record(bssl *this,SSL *ssl,int type,Span<const_unsigned_char> in,uint16_t epoch)

{
  DTLSRecordNumber this_00;
  bool bVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  uchar *out;
  uchar *in_00;
  undefined4 in_register_00000014;
  byte local_6d;
  undefined1 auStack_68 [4];
  int ret;
  Span<unsigned_char> local_58;
  size_t local_48;
  size_t ciphertext_len;
  DTLSRecordNumber record_number;
  SSLBuffer *buf;
  uint16_t epoch_local;
  int type_local;
  SSL *ssl_local;
  Span<const_unsigned_char> in_local;
  
  ssl_local = (SSL *)CONCAT44(in_register_00000014,type);
  in_local.data_ = in.data_;
  record_number.combined_ = *(long *)(this + 0x30) + 0x68;
  sVar2 = Span<const_unsigned_char>::size((Span<const_unsigned_char> *)&ssl_local);
  if (0x4000 < sVar2) {
    __assert_fail("in.size() <= SSL3_RT_MAX_PLAIN_LENGTH",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_pkt.cc"
                  ,0x10f,"int bssl::dtls1_write_record(SSL *, int, Span<const uint8_t>, uint16_t)");
  }
  bVar1 = SSLBuffer::empty((SSLBuffer *)record_number.combined_);
  if (bVar1) {
    sVar2 = Span<const_unsigned_char>::size((Span<const_unsigned_char> *)&ssl_local);
    if (sVar2 < 0x4001) {
      DTLSRecordNumber::DTLSRecordNumber((DTLSRecordNumber *)&ciphertext_len);
      this_00 = record_number;
      sVar2 = dtls_seal_prefix_len((SSL *)this,(uint16_t)in.size_);
      sVar3 = Span<const_unsigned_char>::size((Span<const_unsigned_char> *)&ssl_local);
      sVar4 = SSL_max_seal_overhead((SSL *)this);
      bVar1 = SSLBuffer::EnsureCap((SSLBuffer *)this_00.combined_,sVar2,sVar3 + sVar4);
      local_6d = 1;
      if (bVar1) {
        local_58 = SSLBuffer::remaining((SSLBuffer *)record_number.combined_);
        out = Span<unsigned_char>::data(&local_58);
        _auStack_68 = SSLBuffer::remaining((SSLBuffer *)record_number.combined_);
        sVar2 = Span<unsigned_char>::size((Span<unsigned_char> *)auStack_68);
        in_00 = Span<const_unsigned_char>::data((Span<const_unsigned_char> *)&ssl_local);
        sVar3 = Span<const_unsigned_char>::size((Span<const_unsigned_char> *)&ssl_local);
        bVar1 = dtls_seal_record((SSL *)this,(DTLSRecordNumber *)&ciphertext_len,out,&local_48,sVar2
                                 ,(uint8_t)ssl,in_00,sVar3,(uint16_t)in.size_);
        local_6d = bVar1 ^ 0xff;
      }
      if ((local_6d & 1) == 0) {
        SSLBuffer::DidWrite((SSLBuffer *)record_number.combined_,local_48);
        in_local.size_._4_4_ = ssl_write_buffer_flush((SSL *)this);
        if (0 < in_local.size_._4_4_) {
          in_local.size_._4_4_ = 1;
        }
      }
      else {
        SSLBuffer::Clear((SSLBuffer *)record_number.combined_);
        in_local.size_._4_4_ = -1;
      }
    }
    else {
      ERR_put_error(0x10,0,0x44,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_pkt.cc"
                    ,0x116);
      in_local.size_._4_4_ = -1;
    }
    return in_local.size_._4_4_;
  }
  __assert_fail("buf->empty()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_pkt.cc"
                ,0x113,"int bssl::dtls1_write_record(SSL *, int, Span<const uint8_t>, uint16_t)");
}

Assistant:

int dtls1_write_record(SSL *ssl, int type, Span<const uint8_t> in,
                       uint16_t epoch) {
  SSLBuffer *buf = &ssl->s3->write_buffer;
  assert(in.size() <= SSL3_RT_MAX_PLAIN_LENGTH);
  // There should never be a pending write buffer in DTLS. One can't write half
  // a datagram, so the write buffer is always dropped in
  // |ssl_write_buffer_flush|.
  assert(buf->empty());

  if (in.size() > SSL3_RT_MAX_PLAIN_LENGTH) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
    return -1;
  }

  DTLSRecordNumber record_number;
  size_t ciphertext_len;
  if (!buf->EnsureCap(dtls_seal_prefix_len(ssl, epoch),
                      in.size() + SSL_max_seal_overhead(ssl)) ||
      !dtls_seal_record(ssl, &record_number, buf->remaining().data(),
                        &ciphertext_len, buf->remaining().size(), type,
                        in.data(), in.size(), epoch)) {
    buf->Clear();
    return -1;
  }
  buf->DidWrite(ciphertext_len);

  int ret = ssl_write_buffer_flush(ssl);
  if (ret <= 0) {
    return ret;
  }
  return 1;
}